

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_1a34ed5::HandleGetCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  cmMakefile *this;
  bool bVar2;
  ulong uVar3;
  pointer pbVar4;
  long lVar5;
  string *name;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string_view value;
  string_view value_00;
  int index;
  vector<int,_std::allocator<int>_> indexes;
  cmList values;
  optional<cmList> list;
  int local_ec;
  cmExecutionStatus *local_e8;
  string local_e0;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  char *local_a8;
  undefined8 local_a0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_98;
  iterator iStack_90;
  int *local_88;
  string local_80;
  string *local_60;
  string *local_58;
  _Storage<cmList,_false> local_50;
  char local_38;
  
  pbVar4 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)pbVar1 - (long)pbVar4) < 0x80) {
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"sub-command GET requires at least three arguments.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    bVar2 = false;
  }
  else {
    name = pbVar1 + -1;
    GetList((optional<cmList> *)&local_50._M_value,pbVar4 + 1,status->Makefile);
    if (local_38 == '\0') {
      bVar2 = true;
      value_00._M_str = "NOTFOUND";
      value_00._M_len = 8;
      cmMakefile::AddDefinition(status->Makefile,name,value_00);
    }
    else if (local_50._M_value.Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             local_50._M_value.Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"GET given empty list","")
      ;
      std::__cxx11::string::_M_assign((string *)&status->Error);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      bVar2 = false;
    }
    else {
      local_98._M_current = (int *)0x0;
      iStack_90._M_current = (int *)0x0;
      local_88 = (int *)0x0;
      pbVar4 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_e8 = status;
      local_60 = name;
      if (((long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5) - 4U <
          0xfffffffffffffffd) {
        local_58 = (string *)&status->Error;
        uVar3 = 2;
        lVar5 = 0x40;
        do {
          bVar2 = GetIndexArg((string *)((long)&(pbVar4->_M_dataplus)._M_p + lVar5),&local_ec,
                              local_e8->Makefile);
          if (bVar2) {
            if (iStack_90._M_current == local_88) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_98,iStack_90,&local_ec);
            }
            else {
              *iStack_90._M_current = local_ec;
              iStack_90._M_current = iStack_90._M_current + 1;
            }
          }
          else {
            pbVar4 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            local_e0._M_dataplus._M_p = (pointer)0x7;
            local_e0._M_string_length = 0x935909;
            local_e0.field_2._M_allocated_capacity = 0;
            local_c0 = *(undefined8 *)((long)&(pbVar4->_M_dataplus)._M_p + lVar5);
            local_e0.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->_M_string_length + lVar5);
            local_b8 = 0;
            local_b0 = 0x15;
            local_a8 = " is not a valid index";
            local_a0 = 0;
            views._M_len = 3;
            views._M_array = (iterator)&local_e0;
            cmCatViews(&local_80,views);
            std::__cxx11::string::_M_assign(local_58);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
          }
          if (!bVar2) {
            bVar2 = false;
            goto LAB_00493f7b;
          }
          uVar3 = uVar3 + 1;
          pbVar4 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          lVar5 = lVar5 + 0x20;
        } while (uVar3 < ((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5) -
                         1U);
      }
      cmList::get_items<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                ((cmList *)&local_80,&local_50._M_value,local_98,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 iStack_90._M_current);
      this = local_e8->Makefile;
      cmList::to_string_abi_cxx11_(&local_e0,(cmList *)&local_80);
      value._M_str = local_e0._M_dataplus._M_p;
      value._M_len = local_e0._M_string_length;
      cmMakefile::AddDefinition(this,local_60,value);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_80);
      bVar2 = true;
LAB_00493f7b:
      if (local_98._M_current != (int *)0x0) {
        operator_delete(local_98._M_current,(long)local_88 - (long)local_98._M_current);
      }
    }
    if (local_38 == '\x01') {
      local_38 = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_50._M_value.Values);
    }
  }
  return bVar2;
}

Assistant:

bool HandleGetCommand(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  if (args.size() < 4) {
    status.SetError("sub-command GET requires at least three arguments.");
    return false;
  }

  const std::string& listName = args[1];
  const std::string& variableName = args.back();
  // expand the variable
  auto list = GetList(listName, status.GetMakefile());
  if (!list) {
    status.GetMakefile().AddDefinition(variableName, "NOTFOUND");
    return true;
  }
  // FIXME: Add policy to make non-existing lists an error like empty lists.
  if (list->empty()) {
    status.SetError("GET given empty list");
    return false;
  }

  std::vector<int> indexes;
  for (std::size_t cc = 2; cc < args.size() - 1; cc++) {
    int index;
    if (!GetIndexArg(args[cc], &index, status.GetMakefile())) {
      status.SetError(cmStrCat("index: ", args[cc], " is not a valid index"));
      return false;
    }
    indexes.push_back(index);
  }

  try {
    auto values = list->get_items(indexes.begin(), indexes.end());
    status.GetMakefile().AddDefinition(variableName, values.to_string());
    return true;
  } catch (std::out_of_range& e) {
    status.SetError(e.what());
    return false;
  }
}